

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dtfmtsym.cpp
# Opt level: O1

void __thiscall
icu_63::DateFormatSymbols::DateFormatSymbols
          (DateFormatSymbols *this,Locale *locale,char *type,UErrorCode *status)

{
  (this->super_UObject)._vptr_UObject = (_func_int **)&PTR__DateFormatSymbols_0047d4f8;
  (this->fTimeSeparator).super_Replaceable.super_UObject._vptr_UObject =
       (_func_int **)&PTR__UnicodeString_0048be70;
  (this->fTimeSeparator).fUnion.fStackFields.fLengthAndFlags = 2;
  Locale::Locale(&this->fZSFLocale);
  (this->fLocalPatternChars).super_Replaceable.super_UObject._vptr_UObject =
       (_func_int **)&PTR__UnicodeString_0048be70;
  (this->fLocalPatternChars).fUnion.fStackFields.fLengthAndFlags = 2;
  initializeData(this,locale,type,status,'\0');
  return;
}

Assistant:

DateFormatSymbols::DateFormatSymbols(const Locale& locale,
                                     const char *type,
                                     UErrorCode& status)
    : UObject()
{
  initializeData(locale, type,  status);
}